

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceWiseLinearCalib.cpp
# Opt level: O1

float __thiscall tactile::PieceWiseLinearCalib::map(PieceWiseLinearCalib *this,float x)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_header *p_Var4;
  
  if ((this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count < 2) {
    __assert_fail("values.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ubi-agni[P]tactile_filters/PieceWiseLinearCalib.cpp"
                  ,0x30,"virtual float tactile::PieceWiseLinearCalib::map(float) const");
  }
  p_Var4 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var4->_M_header;
  for (; p_Var2 != (_Rb_tree_node_base *)0x0;
      p_Var2 = (&p_Var2->_M_left)[(float)p_Var2[1]._M_color <= x]) {
    if (x < (float)p_Var2[1]._M_color) {
      p_Var3 = p_Var2;
    }
  }
  p_Var2 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var3 != p_Var2) {
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      lVar1 = std::_Rb_tree_decrement(p_Var3);
      return (*(float *)&p_Var3[1].field_0x4 - *(float *)(lVar1 + 0x24)) *
             ((x - *(float *)(lVar1 + 0x20)) /
             ((float)p_Var3[1]._M_color - *(float *)(lVar1 + 0x20))) + *(float *)(lVar1 + 0x24);
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(&p_Var4->_M_header);
  }
  return *(float *)&p_Var2[1].field_0x4;
}

Assistant:

float PieceWiseLinearCalib::map(float x) const
{
	assert(values.size() > 1);
	// retrieve first key that is larger than x
	CalibrationMap::const_iterator next = values.upper_bound(x);
	// if x is smaller than key range, clip to smallest value
	if (next == values.begin()) return values.begin()->second;
	// if x is larger than key range, clip to largest value
	if (next == values.end()) return values.rbegin()->second;
	CalibrationMap::const_iterator prev = next;
	--prev;
	return prev->second +
	       (x - prev->first) / (next->first - prev->first) * (next->second - prev->second);
}